

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaWrite.c
# Opt level: O3

void Pla_WritePla(Pla_Man_t *p,char *pFileName)

{
  Vec_Str_t *__ptr;
  FILE *__s;
  
  __ptr = Pla_WritePlaInt(p);
  if (0 < __ptr->nSize) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      fwrite(__ptr->pArray,1,(long)__ptr->nSize,__s);
      fclose(__s);
    }
  }
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Pla_WritePla( Pla_Man_t * p, char * pFileName )
{
    Vec_Str_t * vOut = Pla_WritePlaInt( p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &vOut );
}